

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Sampler::readFrom(Sampler *this,BinaryReader *binary)

{
  int samplerType;
  Type local_1c;
  
  BinaryReader::read<int,void>(binary,(int *)&local_1c);
  this->type = local_1c;
  BinaryReader::read<int,void>(binary,&this->pixelSamples);
  BinaryReader::read<int,void>(binary,&this->xSamples);
  BinaryReader::read<int,void>(binary,&this->ySamples);
  return;
}

Assistant:

void Sampler::readFrom(BinaryReader &binary) {
      int samplerType;
      binary.read(samplerType);
      type = static_cast<Type>(samplerType);
      binary.read(pixelSamples);
      binary.read(xSamples);
      binary.read(ySamples);
  }